

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# algorithm.hpp
# Opt level: O1

int boost::xpressive::detail::
    toi<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::xpressive::detail::traits<char>>
              (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *begin,__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      end,traits<char> *tr,int radix,int max)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  
  pcVar3 = begin->_M_current;
  if (pcVar3 == end._M_current) {
    iVar2 = 0;
  }
  else {
    iVar2 = 0;
    do {
      iVar1 = (*tr->_vptr_traits[5])(tr,(ulong)(uint)(int)*pcVar3,(ulong)(uint)radix);
      if (iVar1 == -1) {
        return iVar2;
      }
      iVar2 = iVar1 + iVar2 * radix;
      if (max < iVar2) {
        return iVar2 / radix;
      }
      pcVar3 = begin->_M_current + 1;
      begin->_M_current = pcVar3;
    } while (pcVar3 != end._M_current);
  }
  return iVar2;
}

Assistant:

int toi(InIter &begin, InIter end, Traits const &tr, int radix = 10, int max = INT_MAX)
{
    detail::ignore_unused(tr);
    int i = 0, c = 0;
    for(; begin != end && -1 != (c = tr.value(*begin, radix)); ++begin)
    {
        if(max < ((i *= radix) += c))
            return i / radix;
    }
    return i;
}